

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

int __thiscall hwnet::Epoll::Add(Epoll *this,Ptr *channel,int flag)

{
  undefined1 auVar1 [4];
  int __fd;
  int iVar2;
  element_type *peVar3;
  uint local_34;
  undefined1 local_30 [4];
  int et;
  epoll_event ev;
  int flag_local;
  Ptr *channel_local;
  Epoll *this_local;
  
  ev.data.fd = flag;
  unique0x100000c9 = &channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>;
  memset(local_30,0,0xc);
  _et = std::__shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>::get(stack0xffffffffffffffe0);
  if ((ev.data.u32 & 2) != 0) {
    local_30 = (undefined1  [4])((uint)local_30 | 1);
  }
  if ((ev.data.u32 & 4) != 0) {
    local_30 = (undefined1  [4])((uint)local_30 | 4);
  }
  local_34 = 0;
  if ((ev.data.u32 & 8) != 0) {
    local_34 = 0x80000000;
  }
  local_30 = (undefined1  [4])(local_34 | 0x2018 | (uint)local_30);
  iVar2 = this->epfd;
  peVar3 = std::__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)stack0xffffffffffffffe0);
  __fd = (*peVar3->_vptr_Channel[1])();
  iVar2 = epoll_ctl(iVar2,1,__fd,(epoll_event *)local_30);
  auVar1 = local_30;
  if (iVar2 == 0) {
    peVar3 = std::__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)stack0xffffffffffffffe0);
    peVar3->events = (int)auVar1;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Epoll::Add(const Channel::Ptr &channel,int flag) {
	epoll_event ev = {0};
	ev.data.ptr = channel.get();

	if(flag & Poller::Read) {
		ev.events |= EPOLLIN;
	}

	if(flag & Poller::Write) {
		ev.events |= EPOLLOUT;
	}

	int et = 0;
	if(flag & Poller::ET) {
		et = EPOLLET;
	}

	ev.events |= EPOLLERR | EPOLLHUP | EPOLLRDHUP | et;

	if(0 == epoll_ctl(this->epfd,EPOLL_CTL_ADD,channel->Fd(),&ev)){
		channel->events = ev.events;
		return 0;
	} else {
		return -1;
	}
}